

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

ActivationTanh * __thiscall
CoreML::Specification::ActivationTanh::New(ActivationTanh *this,Arena *arena)

{
  ActivationTanh *this_00;
  
  this_00 = (ActivationTanh *)operator_new(0x18);
  ActivationTanh(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ActivationTanh>(arena,this_00);
  }
  return this_00;
}

Assistant:

ActivationTanh* ActivationTanh::New(::google::protobuf::Arena* arena) const {
  ActivationTanh* n = new ActivationTanh;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}